

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  size_t __n;
  uint uVar1;
  u32 uVar2;
  sqlite3_vtab *psVar3;
  char *pcVar4;
  Fts5IndexIter *pIndexIter;
  u8 *a;
  u32 uVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  sqlite3_module **ppsVar15;
  u32 nData;
  sqlite3_module *psVar16;
  sqlite3_vtab *psVar17;
  int iOff;
  i64 iPos;
  int local_5c;
  i64 local_58;
  int local_50;
  int local_4c;
  long local_48;
  sqlite3_vtab *local_40;
  Fts5Buffer *local_38;
  
  psVar17 = pCursor->pVtab;
  local_50 = 0;
  psVar16 = pCursor[2].pVtab[1].pModule;
  uVar1 = *(uint *)&psVar16->xBestIndex;
  local_48 = (long)(int)uVar1;
  pCursor[10].pVtab = (sqlite3_vtab *)((long)&(pCursor[10].pVtab)->pModule + 1);
  local_4c = local_50;
  if (psVar17[2].nRef == 0) {
    uVar13 = (ulong)*(int *)&pCursor[7].pVtab;
    uVar14 = *(int *)&pCursor[7].pVtab + 1;
    uVar6 = uVar13;
    if ((int)uVar14 < (int)uVar1) {
      uVar14 = uVar1;
    }
    do {
      uVar11 = uVar14;
      if (local_48 <= (long)(uVar6 + 1)) break;
      uVar11 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar11;
      lVar8 = uVar6 * 2;
      uVar6 = uVar6 + 1;
    } while (*(long *)(&(pCursor[9].pVtab)->nRef + lVar8) == 0);
    *(uint *)&pCursor[7].pVtab = uVar11;
    if (*(int *)&pCursor[7].pVtab < (int)uVar1) goto LAB_001b2a35;
  }
  else if (psVar17[2].nRef == 2) {
    iVar12 = *(int *)((long)&psVar16->xColumn + 4);
    psVar17 = pCursor[4].pVtab;
    do {
      if ((iVar12 != 1) &&
         (iVar9 = sqlite3Fts5PoslistNext64
                            (*(u8 **)&psVar17->nRef,*(int *)&psVar17->zErrMsg,(int *)(pCursor + 0xe)
                             ,(i64 *)(pCursor + 0xd)), iVar9 == 0)) {
        return 0;
      }
      pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
      *(undefined4 *)&pCursor[0xe].pVtab = 0;
      iVar9 = sqlite3Fts5IterNextScan((Fts5IndexIter *)pCursor[4].pVtab);
      if (iVar9 == 0) {
        iVar9 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
        if (iVar12 == 1) {
          return iVar9;
        }
        if (*(int *)&pCursor[3].pVtab != 0) {
          return iVar9;
        }
      }
      if (iVar9 != 0) {
        *(undefined4 *)&pCursor[3].pVtab = 1;
        return iVar9;
      }
    } while( true );
  }
  psVar3 = pCursor[4].pVtab;
  if (*(char *)((long)&psVar3->zErrMsg + 4) == '\0') {
    pcVar4 = psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 7].zErrMsg;
    nData = *(int *)&psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 8].pModule - 1;
    uVar2 = *(u32 *)&pCursor[5].pVtab;
    if (-1 < (int)uVar2) {
      uVar5 = uVar2;
      if ((int)nData < (int)uVar2) {
        uVar5 = nData;
      }
      iVar12 = memcmp(pCursor[6].pVtab,pcVar4 + 1,(long)(int)uVar5);
      if ((iVar12 < 0) || ((int)uVar2 < (int)nData && iVar12 == 0)) {
        *(undefined4 *)&pCursor[3].pVtab = 1;
        return 0;
      }
    }
    *(undefined4 *)&pCursor[0xc].pVtab = 0;
    local_40 = psVar17;
    sqlite3Fts5BufferAppendBlob(&local_50,(Fts5Buffer *)(pCursor + 0xb),nData,(u8 *)(pcVar4 + 1));
    lVar8 = local_48;
    __n = local_48 * 8;
    memset(pCursor[8].pVtab,0,__n);
    memset(pCursor[9].pVtab,0,__n);
    *(undefined4 *)&pCursor[7].pVtab = 0;
    local_38 = (Fts5Buffer *)(pCursor + 0xb);
    local_4c = local_50;
    psVar17 = local_40;
    psVar3 = local_40;
    do {
      if (local_4c != 0) break;
      iVar12 = *(int *)((long)&(pCursor[2].pVtab[1].pModule)->xColumn + 4);
      local_58 = 0;
      local_5c = 0;
      pIndexIter = (Fts5IndexIter *)pCursor[4].pVtab;
      a = pIndexIter->pData;
      iVar9 = pIndexIter->nData;
      local_40 = psVar3;
      if (psVar17[2].nRef == 0) {
        if (iVar12 == 2) {
          while (iVar12 = sqlite3Fts5PoslistNext64(a,iVar9,&local_5c,&local_58), iVar12 == 0) {
            if (lVar8 <= local_58) {
              local_4c = 0x10b;
              break;
            }
            ppsVar15 = &(pCursor[9].pVtab)->pModule + local_58;
            *ppsVar15 = (sqlite3_module *)((long)&(*ppsVar15)->iVersion + 1);
          }
        }
        else {
          if (iVar12 != 0) goto LAB_001b2c86;
          iVar12 = -1;
          do {
            iVar10 = sqlite3Fts5PoslistNext64(a,iVar9,&local_5c,&local_58);
            psVar17 = psVar3;
            if (iVar10 != 0) break;
            iVar10 = (int)((ulong)local_58 >> 0x20);
            if (iVar12 == iVar10) {
LAB_001b2c62:
              ppsVar15 = &(pCursor[8].pVtab)->pModule + (local_58 >> 0x20);
              *ppsVar15 = (sqlite3_module *)((long)&(*ppsVar15)->iVersion + 1);
              bVar7 = true;
            }
            else {
              if (iVar10 < (int)local_48) {
                ppsVar15 = &(pCursor[9].pVtab)->pModule + (local_58 >> 0x20);
                *ppsVar15 = (sqlite3_module *)((long)&(*ppsVar15)->iVersion + 1);
                iVar12 = iVar10;
                goto LAB_001b2c62;
              }
              local_4c = 0x10b;
              bVar7 = false;
            }
          } while (bVar7);
        }
      }
      else if (psVar17[2].nRef == 1) {
        if ((iVar12 == 0) &&
           (iVar12 = sqlite3Fts5PoslistNext64(a,iVar9,&local_5c,&local_58), iVar12 == 0)) {
          psVar17 = pCursor[8].pVtab;
          psVar16 = psVar17->pModule;
          do {
            psVar16 = (sqlite3_module *)((long)&psVar16->iVersion + 1);
            psVar17->pModule = psVar16;
            iVar12 = sqlite3Fts5PoslistNext64(a,iVar9,&local_5c,&local_58);
          } while (iVar12 == 0);
        }
LAB_001b2c86:
        (pCursor[9].pVtab)->pModule =
             (sqlite3_module *)((long)&(pCursor[9].pVtab)->pModule->iVersion + 1);
        psVar17 = local_40;
      }
      iVar12 = local_4c;
      if (local_4c == 0) {
        iVar12 = sqlite3Fts5IterNextScan(pIndexIter);
      }
      lVar8 = local_48;
      if (psVar17[2].nRef == 2) {
        bVar7 = false;
      }
      else {
        if (iVar12 == 0) {
          psVar3 = pCursor[4].pVtab;
          uVar1 = *(int *)&psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 8].pModule - 1;
          if ((uVar1 != *(uint *)&pCursor[0xc].pVtab) ||
             (((1 < *(int *)&psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 8].pModule &&
               (iVar9 = bcmp(psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 7].zErrMsg + 1,
                             local_38->p,(ulong)uVar1), iVar9 != 0)) ||
              (*(char *)((long)&psVar3->zErrMsg + 4) != '\0')))) {
            bVar7 = false;
            goto LAB_001b2d6e;
          }
        }
        bVar7 = true;
      }
LAB_001b2d6e:
      local_4c = iVar12;
      psVar3 = local_40;
    } while (bVar7);
  }
  else {
    *(undefined4 *)&pCursor[3].pVtab = 1;
  }
LAB_001b2a35:
  local_50 = local_4c;
  if (((local_50 == 0) && (*(int *)&pCursor[3].pVtab == 0)) && (psVar17[2].nRef == 0)) {
    iVar12 = *(int *)&pCursor[7].pVtab;
    if ((&(pCursor[9].pVtab)->pModule)[iVar12] == (sqlite3_module *)0x0) {
      ppsVar15 = &(pCursor[9].pVtab)->pModule + iVar12;
      do {
        ppsVar15 = ppsVar15 + 1;
        iVar12 = iVar12 + 1;
      } while (*ppsVar15 == (sqlite3_module *)0x0);
      *(int *)&pCursor[7].pVtab = iVar12;
    }
  }
  return local_50;
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int rc = SQLITE_OK;
  int nCol = pCsr->pFts5->pConfig->nCol;

  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            if( eDetail==FTS5_DETAIL_FULL ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                pCsr->aCnt[0]++;
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n 
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm)) 
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    while( pCsr->aDoc[pCsr->iCol]==0 ) pCsr->iCol++;
    assert( pCsr->iCol<pCsr->pFts5->pConfig->nCol );
  }
  return rc;
}